

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ge(void)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  secp256k1_gej *r_00;
  void *__ptr;
  int odd;
  int ret_set_xo;
  int ret_frac_on_curve;
  int ret_on_curve;
  secp256k1_ge q;
  secp256k1_fe n_1;
  secp256k1_fe n;
  secp256k1_fe s;
  secp256k1_ge *ge_set_all;
  secp256k1_gej t;
  int swap;
  secp256k1_gej *gej_shuffled;
  secp256k1_gej sum;
  secp256k1_fe zr2;
  secp256k1_ge ge2_zfi;
  secp256k1_fe zrz_1;
  secp256k1_fe zrz;
  secp256k1_fe zr;
  secp256k1_ge ref;
  secp256k1_gej resj;
  secp256k1_gej refj;
  int i2;
  int expect_equal;
  secp256k1_ge g;
  int k;
  int j;
  secp256k1_fe zfi3;
  secp256k1_fe zfi2;
  secp256k1_fe r;
  secp256k1_fe zf;
  secp256k1_gej *gej;
  secp256k1_ge *ge;
  int runs;
  int i1;
  int i;
  secp256k1_gej *in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  uint32_t in_stack_fffffffffffffa44;
  bool local_5b5;
  int in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  secp256k1_gej *in_stack_fffffffffffffa60;
  secp256k1_ge *in_stack_fffffffffffffa68;
  secp256k1_fe *in_stack_fffffffffffffa70;
  secp256k1_gej *in_stack_fffffffffffffa78;
  secp256k1_ge *in_stack_fffffffffffffa80;
  secp256k1_gej *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffa94;
  secp256k1_ge *in_stack_fffffffffffffaa0;
  secp256k1_gej *in_stack_fffffffffffffaa8;
  secp256k1_gej *in_stack_fffffffffffffab0;
  secp256k1_gej *in_stack_fffffffffffffab8;
  secp256k1_gej *in_stack_fffffffffffffac0;
  undefined1 local_488 [80];
  secp256k1_fe *in_stack_fffffffffffffbc8;
  secp256k1_ge *in_stack_fffffffffffffbd0;
  secp256k1_gej *in_stack_fffffffffffffbd8;
  secp256k1_gej *in_stack_fffffffffffffbe0;
  secp256k1_fe *in_stack_fffffffffffffbe8;
  secp256k1_gej *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  secp256k1_gej *in_stack_fffffffffffffc00;
  undefined1 local_3f8 [48];
  secp256k1_fe *in_stack_fffffffffffffc38;
  secp256k1_ge *in_stack_fffffffffffffc40;
  secp256k1_gej *in_stack_fffffffffffffc48;
  secp256k1_gej *in_stack_fffffffffffffc50;
  undefined1 local_350 [168];
  secp256k1_gej local_2a8 [3];
  int local_128;
  uint local_124;
  undefined1 local_120 [88];
  int local_c8;
  int local_c4;
  void *local_20;
  void *local_18;
  int local_c;
  int local_8;
  int local_4;
  
  local_c = 6;
  local_18 = checked_malloc((secp256k1_callback *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (size_t)in_stack_fffffffffffffa38);
  local_20 = checked_malloc((secp256k1_callback *)
                            CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            (size_t)in_stack_fffffffffffffa38);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x1343ec);
  secp256k1_ge_set_infinity((secp256k1_ge *)0x1343f9);
  local_4 = 0;
  do {
    if (local_c <= local_4) {
      testutil_random_fe_non_zero_test((secp256k1_fe *)0x134ad3);
      testutil_random_fe_magnitude
                (in_stack_fffffffffffffa70,(int)((ulong)in_stack_fffffffffffffa68 >> 0x20));
      secp256k1_fe_impl_inv_var
                ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 &in_stack_fffffffffffffa88->x);
      secp256k1_fe_impl_sqr
                ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 &in_stack_fffffffffffffa38->x);
      secp256k1_fe_impl_mul
                ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x134b27);
      testutil_random_fe_non_zero_test((secp256k1_fe *)0x134b34);
      local_8 = 0;
      do {
        if (local_c * 4 + 1 <= local_8) {
          memset(local_3f8,0,0x80);
          r_00 = (secp256k1_gej *)
                 checked_malloc((secp256k1_callback *)
                                CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                                (size_t)in_stack_fffffffffffffa38);
          for (local_4 = 0; local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
            memcpy(r_00 + local_4,(void *)((long)local_20 + (long)local_4 * 0x80),0x80);
          }
          for (local_4 = 0; iVar3 = local_4, local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
            uVar5 = testrand_int(in_stack_fffffffffffffa44);
            in_stack_fffffffffffffbfc = iVar3 + uVar5;
            if (in_stack_fffffffffffffbfc != local_4) {
              memcpy(local_488,r_00 + local_4,0x80);
              memcpy(r_00 + local_4,r_00 + in_stack_fffffffffffffbfc,0x80);
              memcpy(r_00 + in_stack_fffffffffffffbfc,local_488,0x80);
            }
          }
          for (local_4 = 0; local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
            secp256k1_gej_add_var
                      (r_00,(secp256k1_gej *)
                            CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                       in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
          }
          iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x135916);
          if (iVar3 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                    ,0xeea,"test condition failed: secp256k1_gej_is_infinity(&sum)");
            abort();
          }
          free(r_00);
          __ptr = checked_malloc((secp256k1_callback *)
                                 CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                                 (size_t)in_stack_fffffffffffffa38);
          secp256k1_ge_set_all_gej_var
                    (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                     (size_t)in_stack_fffffffffffffa70);
          for (local_4 = 0; local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
            testutil_random_fe_non_zero((secp256k1_fe *)0x1359f3);
            secp256k1_gej_rescale
                      (in_stack_fffffffffffffa60,
                       (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                      );
            iVar3 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xef6,
                      "test condition failed: secp256k1_gej_eq_ge_var(&gej[i], &ge_set_all[i])");
              abort();
            }
          }
          free(__ptr);
          local_4 = 1;
          while( true ) {
            if (local_c * 4 + 1 <= local_4) {
              secp256k1_fe_impl_mul
                        ((secp256k1_fe *)
                         CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                         &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x135c05);
              iVar3 = secp256k1_ge_x_on_curve_var(&in_stack_fffffffffffffa60->x);
              iVar6 = secp256k1_ge_x_frac_on_curve_var
                                ((secp256k1_fe *)
                                 CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                                 &in_stack_fffffffffffffa88->x);
              iVar7 = secp256k1_ge_set_xo_var
                                (in_stack_fffffffffffffaa0,(secp256k1_fe *)CONCAT44(iVar3,iVar6),
                                 in_stack_fffffffffffffa94);
              if (iVar3 != iVar6) {
                fprintf(_stderr,"%s:%d: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                        ,0xf0d,"test condition failed: ret_on_curve == ret_frac_on_curve");
                abort();
              }
              if (iVar3 != iVar7) {
                fprintf(_stderr,"%s:%d: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                        ,0xf0e,"test condition failed: ret_on_curve == ret_set_xo");
                abort();
              }
              if ((iVar7 != 0) &&
                 (iVar3 = secp256k1_fe_equal(&in_stack_fffffffffffffa60->x,
                                             (secp256k1_fe *)
                                             CONCAT44(in_stack_fffffffffffffa5c,
                                                      in_stack_fffffffffffffa58)), iVar3 == 0)) {
                fprintf(_stderr,"%s:%d: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                        ,0xf0f,"test condition failed: secp256k1_fe_equal(&r, &q.x)");
                abort();
              }
              local_4 = 0;
              while( true ) {
                if (local_c * 4 + 1 <= local_4) {
                  secp256k1_ge_set_all_gej_var
                            (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                             (size_t)in_stack_fffffffffffffa70);
                  local_4 = 0;
                  while( true ) {
                    if (local_c * 4 + 1 <= local_4) {
                      for (local_4 = 0; local_4 < local_c * 4 + 1; local_4 = local_4 + 1) {
                        secp256k1_gej_set_infinity((secp256k1_gej *)0x135fb3);
                      }
                      secp256k1_ge_set_all_gej_var
                                (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                                 (size_t)in_stack_fffffffffffffa70);
                      local_4 = 0;
                      while( true ) {
                        if (local_c * 4 + 1 <= local_4) {
                          free(local_18);
                          free(local_20);
                          return;
                        }
                        iVar3 = secp256k1_ge_is_infinity((secp256k1_ge *)0x13602c);
                        if (iVar3 == 0) break;
                        local_4 = local_4 + 1;
                      }
                      fprintf(_stderr,"%s:%d: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                              ,0xf2d,"test condition failed: secp256k1_ge_is_infinity(&ge[i])");
                      abort();
                    }
                    iVar3 = secp256k1_gej_eq_ge_var
                                      (in_stack_fffffffffffffac0,
                                       (secp256k1_ge *)in_stack_fffffffffffffab8);
                    if (iVar3 == 0) break;
                    local_4 = local_4 + 1;
                  }
                  fprintf(_stderr,"%s:%d: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                          ,0xf22,"test condition failed: secp256k1_gej_eq_ge_var(&gej[i], &ge[i])");
                  abort();
                }
                testutil_random_ge_test((secp256k1_ge *)in_stack_fffffffffffffa60);
                uVar4 = secp256k1_fe_impl_is_odd
                                  ((secp256k1_fe *)((long)local_18 + (long)local_4 * 0x58));
                local_5b5 = 1 < uVar4;
                if (local_5b5) break;
                if (uVar4 == local_4 % 2) {
                  secp256k1_ge_set_infinity((secp256k1_ge *)0x135e49);
                }
                secp256k1_gej_set_ge
                          ((secp256k1_gej *)CONCAT44(uVar4,in_stack_fffffffffffffa40),
                           (secp256k1_ge *)in_stack_fffffffffffffa38);
                local_4 = local_4 + 1;
              }
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xf17,"test condition failed: odd == 0 || odd == 1");
              abort();
            }
            iVar3 = secp256k1_ge_x_on_curve_var(&in_stack_fffffffffffffa60->x);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xefe,"test condition failed: secp256k1_ge_x_on_curve_var(&ge[i].x)");
              abort();
            }
            secp256k1_fe_impl_mul
                      ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40)
                       ,&in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x135b72);
            iVar3 = secp256k1_ge_x_frac_on_curve_var
                              ((secp256k1_fe *)
                               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                               &in_stack_fffffffffffffa88->x);
            if (iVar3 == 0) break;
            local_4 = local_4 + 1;
          }
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                  ,0xf01,"test condition failed: secp256k1_ge_x_frac_on_curve_var(&n, &zf)");
          abort();
        }
        for (local_128 = 0; local_128 < local_c * 4 + 1; local_128 = local_128 + 1) {
          in_stack_fffffffffffffa80 = (secp256k1_ge *)((long)local_20 + (long)local_8 * 0x80);
          in_stack_fffffffffffffa88 = (secp256k1_gej *)((long)local_20 + (long)local_128 * 0x80);
          iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x134bd6);
          if (iVar3 == 0) {
            in_stack_fffffffffffffa78 = local_2a8;
          }
          else {
            in_stack_fffffffffffffa78 = (secp256k1_gej *)0x0;
          }
          secp256k1_gej_add_var
                    (in_stack_fffffffffffffc00,
                     (secp256k1_gej *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                     in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
          iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x134c2b);
          if ((iVar3 == 0) &&
             (iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x134c41), iVar3 == 0)) {
            secp256k1_fe_impl_mul
                      ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40)
                       ,&in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x134c7a);
            iVar3 = secp256k1_fe_equal(&in_stack_fffffffffffffa60->x,
                                       (secp256k1_fe *)
                                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                                      );
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xe96,"test condition failed: secp256k1_fe_equal(&zrz, &refj.z)");
              abort();
            }
          }
          secp256k1_ge_set_gej_var
                    ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     in_stack_fffffffffffffa88);
          in_stack_fffffffffffffa70 = (secp256k1_fe *)((long)local_18 + (long)local_128 * 0x58);
          iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x134d47);
          if (iVar3 == 0) {
            in_stack_fffffffffffffa60 = local_2a8;
          }
          else {
            in_stack_fffffffffffffa60 = (secp256k1_gej *)0x0;
          }
          secp256k1_gej_add_ge_var
                    (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8);
          iVar3 = secp256k1_gej_eq_ge_var
                            (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
          if (iVar3 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                    ,0xe9c,"test condition failed: secp256k1_gej_eq_ge_var(&resj, &ref)");
            abort();
          }
          iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x134dfa);
          if ((iVar3 == 0) &&
             (iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x134e10), iVar3 == 0)) {
            secp256k1_fe_impl_mul
                      ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40)
                       ,&in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x134e49);
            iVar3 = secp256k1_fe_equal(&in_stack_fffffffffffffa60->x,
                                       (secp256k1_fe *)
                                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                                      );
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xe9f,"test condition failed: secp256k1_fe_equal(&zrz, &resj.z)");
              abort();
            }
          }
          memcpy(local_350,(void *)((long)local_18 + (long)local_128 * 0x58),0x58);
          secp256k1_fe_impl_mul
                    ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x134ef3);
          secp256k1_fe_impl_mul
                    ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     &in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x134f18);
          testutil_random_ge_x_magnitude((secp256k1_ge *)0x134f25);
          testutil_random_ge_y_magnitude((secp256k1_ge *)0x134f32);
          secp256k1_gej_add_zinv_var
                    (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     in_stack_fffffffffffffc38);
          iVar3 = secp256k1_gej_eq_ge_var
                            (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
          if (iVar3 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                    ,0xeaa,"test condition failed: secp256k1_gej_eq_ge_var(&resj, &ref)");
            abort();
          }
          if (local_128 != 0) {
            secp256k1_gej_add_ge
                      (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40
                      );
            iVar3 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xeb1,"test condition failed: secp256k1_gej_eq_ge_var(&resj, &ref)");
              abort();
            }
          }
          if (((local_8 == 0) && (local_128 == 0)) ||
             ((in_stack_fffffffffffffa5c = (local_8 + 3) / 4,
              in_stack_fffffffffffffa5c == (local_128 + 3) / 4 &&
              (uVar1 = (long)(local_8 + 3) % 4,
              in_stack_fffffffffffffa58 =
                   (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2)
              , uVar1 = (long)(local_128 + 3) % 4,
              in_stack_fffffffffffffa58 ==
              (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2)))))
          {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)
                       CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                       in_stack_fffffffffffffa38,(secp256k1_fe *)0x135131);
            iVar3 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xeb9,"test condition failed: secp256k1_gej_eq_ge_var(&resj, &ref)");
              abort();
            }
            secp256k1_fe_impl_mul
                      ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40)
                       ,&in_stack_fffffffffffffa38->x,(secp256k1_fe *)0x1351ba);
            iVar3 = secp256k1_fe_equal(&in_stack_fffffffffffffa60->x,
                                       (secp256k1_fe *)
                                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58)
                                      );
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xebc,"test condition failed: secp256k1_fe_equal(&zr2, &resj.z)");
              abort();
            }
            secp256k1_gej_double_var
                      ((secp256k1_gej *)
                       CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                       in_stack_fffffffffffffa38,(secp256k1_fe *)0x135244);
            iVar3 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xebf,"test condition failed: secp256k1_gej_eq_ge_var(&resj, &ref)");
              abort();
            }
            secp256k1_gej_double(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
            iVar3 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xec2,"test condition failed: secp256k1_gej_eq_ge_var(&resj, &ref)");
              abort();
            }
          }
          if ((((local_8 == 0) && (local_128 == 0)) ||
              (((local_8 + 3) / 4 == (local_128 + 3) / 4 &&
               (uVar1 = (long)(local_8 + 3) % 4, uVar2 = (long)(local_128 + 3) % 4,
               (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2) !=
               (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 2)))))
             && (iVar3 = secp256k1_ge_is_infinity((secp256k1_ge *)0x1353c5), iVar3 == 0)) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                    ,0xec7,"test condition failed: secp256k1_ge_is_infinity(&ref)");
            abort();
          }
          if (local_8 == 0) {
            iVar3 = secp256k1_ge_is_infinity((secp256k1_ge *)0x13543c);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xecc,"test condition failed: secp256k1_ge_is_infinity(&ge[i1])");
              abort();
            }
            iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1354a3);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xecd,"test condition failed: secp256k1_gej_is_infinity(&gej[i1])");
              abort();
            }
            iVar3 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xece,"test condition failed: secp256k1_gej_eq_ge_var(&gej[i2], &ref)");
              abort();
            }
          }
          if (local_128 == 0) {
            iVar3 = secp256k1_ge_is_infinity((secp256k1_ge *)0x135589);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xed1,"test condition failed: secp256k1_ge_is_infinity(&ge[i2])");
              abort();
            }
            iVar3 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1355f0);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xed2,"test condition failed: secp256k1_gej_is_infinity(&gej[i2])");
              abort();
            }
            iVar3 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
            if (iVar3 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                      ,0xed3,"test condition failed: secp256k1_gej_eq_ge_var(&gej[i1], &ref)");
              abort();
            }
          }
        }
        local_8 = local_8 + 1;
      } while( true );
    }
    testutil_random_ge_test((secp256k1_ge *)in_stack_fffffffffffffa60);
    if (local_c + -2 <= local_4) {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (secp256k1_ge *)in_stack_fffffffffffffa38);
      iVar3 = secp256k1_ge_eq_var(in_stack_fffffffffffffa68,
                                  (secp256k1_ge *)in_stack_fffffffffffffa60);
      if (iVar3 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                ,0xe61,"test condition failed: !secp256k1_ge_eq_var(&g, &ge[1])");
        abort();
      }
    }
    if (local_c + -1 <= local_4) {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (secp256k1_ge *)in_stack_fffffffffffffa38);
    }
    memcpy((void *)((long)local_18 + (long)(local_4 * 4 + 1) * 0x58),local_120,0x58);
    memcpy((void *)((long)local_18 + (long)(local_4 * 4 + 2) * 0x58),local_120,0x58);
    secp256k1_ge_neg((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     (secp256k1_ge *)in_stack_fffffffffffffa38);
    secp256k1_ge_neg((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                     (secp256k1_ge *)in_stack_fffffffffffffa38);
    secp256k1_gej_set_ge
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (secp256k1_ge *)in_stack_fffffffffffffa38);
    testutil_random_ge_jacobian_test
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
               (secp256k1_ge *)in_stack_fffffffffffffa88);
    secp256k1_gej_set_ge
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (secp256k1_ge *)in_stack_fffffffffffffa38);
    testutil_random_ge_jacobian_test
              ((secp256k1_gej *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
               (secp256k1_ge *)in_stack_fffffffffffffa88);
    for (local_c4 = 0; local_c4 < 4; local_c4 = local_c4 + 1) {
      testutil_random_ge_x_magnitude((secp256k1_ge *)0x1346dd);
      testutil_random_ge_y_magnitude((secp256k1_ge *)0x134709);
      testutil_random_gej_x_magnitude((secp256k1_gej *)0x134735);
      testutil_random_gej_y_magnitude((secp256k1_gej *)0x134761);
      testutil_random_gej_z_magnitude((secp256k1_gej *)0x13478d);
    }
    for (local_c4 = 0; local_c4 < 4; local_c4 = local_c4 + 1) {
      for (local_c8 = 0; local_c8 < 4; local_c8 = local_c8 + 1) {
        local_124 = (uint)(local_c4 >> 1 == local_c8 >> 1);
        uVar4 = secp256k1_ge_eq_var(in_stack_fffffffffffffa68,
                                    (secp256k1_ge *)in_stack_fffffffffffffa60);
        if (uVar4 != local_124) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                  ,0xe79,
                  "test condition failed: secp256k1_ge_eq_var(&ge[1 + j + 4 * i], &ge[1 + k + 4 * i]) == expect_equal"
                 );
          abort();
        }
        uVar4 = secp256k1_gej_eq_var(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
        if (uVar4 != local_124) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                  ,0xe7a,
                  "test condition failed: secp256k1_gej_eq_var(&gej[1 + j + 4 * i], &gej[1 + k + 4 * i]) == expect_equal"
                 );
          abort();
        }
        uVar4 = secp256k1_gej_eq_ge_var
                          (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
        if (uVar4 != local_124) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                  ,0xe7b,
                  "test condition failed: secp256k1_gej_eq_ge_var(&gej[1 + j + 4 * i], &ge[1 + k + 4 * i]) == expect_equal"
                 );
          abort();
        }
        uVar4 = secp256k1_gej_eq_ge_var
                          (in_stack_fffffffffffffac0,(secp256k1_ge *)in_stack_fffffffffffffab8);
        if (uVar4 != local_124) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
                  ,0xe7c,
                  "test condition failed: secp256k1_gej_eq_ge_var(&gej[1 + k + 4 * i], &ge[1 + j + 4 * i]) == expect_equal"
                 );
          abort();
        }
      }
    }
    local_4 = local_4 + 1;
  } while( true );
}

Assistant:

static void test_ge(void) {
    int i, i1;
    int runs = 6;
    /* 25 points are used:
     * - infinity
     * - for each of four random points p1 p2 p3 p4, we add the point, its
     *   negation, and then those two again but with randomized Z coordinate.
     * - The same is then done for lambda*p1 and lambda^2*p1.
     */
    secp256k1_ge *ge = (secp256k1_ge *)checked_malloc(&CTX->error_callback, sizeof(secp256k1_ge) * (1 + 4 * runs));
    secp256k1_gej *gej = (secp256k1_gej *)checked_malloc(&CTX->error_callback, sizeof(secp256k1_gej) * (1 + 4 * runs));
    secp256k1_fe zf, r;
    secp256k1_fe zfi2, zfi3;

    secp256k1_gej_set_infinity(&gej[0]);
    secp256k1_ge_set_infinity(&ge[0]);
    for (i = 0; i < runs; i++) {
        int j, k;
        secp256k1_ge g;
        testutil_random_ge_test(&g);
        if (i >= runs - 2) {
            secp256k1_ge_mul_lambda(&g, &ge[1]);
            CHECK(!secp256k1_ge_eq_var(&g, &ge[1]));
        }
        if (i >= runs - 1) {
            secp256k1_ge_mul_lambda(&g, &g);
        }
        ge[1 + 4 * i] = g;
        ge[2 + 4 * i] = g;
        secp256k1_ge_neg(&ge[3 + 4 * i], &g);
        secp256k1_ge_neg(&ge[4 + 4 * i], &g);
        secp256k1_gej_set_ge(&gej[1 + 4 * i], &ge[1 + 4 * i]);
        testutil_random_ge_jacobian_test(&gej[2 + 4 * i], &ge[2 + 4 * i]);
        secp256k1_gej_set_ge(&gej[3 + 4 * i], &ge[3 + 4 * i]);
        testutil_random_ge_jacobian_test(&gej[4 + 4 * i], &ge[4 + 4 * i]);
        for (j = 0; j < 4; j++) {
            testutil_random_ge_x_magnitude(&ge[1 + j + 4 * i]);
            testutil_random_ge_y_magnitude(&ge[1 + j + 4 * i]);
            testutil_random_gej_x_magnitude(&gej[1 + j + 4 * i]);
            testutil_random_gej_y_magnitude(&gej[1 + j + 4 * i]);
            testutil_random_gej_z_magnitude(&gej[1 + j + 4 * i]);
        }

        for (j = 0; j < 4; ++j) {
            for (k = 0; k < 4; ++k) {
                int expect_equal = (j >> 1) == (k >> 1);
                CHECK(secp256k1_ge_eq_var(&ge[1 + j + 4 * i], &ge[1 + k + 4 * i]) == expect_equal);
                CHECK(secp256k1_gej_eq_var(&gej[1 + j + 4 * i], &gej[1 + k + 4 * i]) == expect_equal);
                CHECK(secp256k1_gej_eq_ge_var(&gej[1 + j + 4 * i], &ge[1 + k + 4 * i]) == expect_equal);
                CHECK(secp256k1_gej_eq_ge_var(&gej[1 + k + 4 * i], &ge[1 + j + 4 * i]) == expect_equal);
            }
        }
    }

    /* Generate random zf, and zfi2 = 1/zf^2, zfi3 = 1/zf^3 */
    testutil_random_fe_non_zero_test(&zf);
    testutil_random_fe_magnitude(&zf, 8);
    secp256k1_fe_inv_var(&zfi3, &zf);
    secp256k1_fe_sqr(&zfi2, &zfi3);
    secp256k1_fe_mul(&zfi3, &zfi3, &zfi2);

    /* Generate random r */
    testutil_random_fe_non_zero_test(&r);

    for (i1 = 0; i1 < 1 + 4 * runs; i1++) {
        int i2;
        for (i2 = 0; i2 < 1 + 4 * runs; i2++) {
            /* Compute reference result using gej + gej (var). */
            secp256k1_gej refj, resj;
            secp256k1_ge ref;
            secp256k1_fe zr;
            secp256k1_gej_add_var(&refj, &gej[i1], &gej[i2], secp256k1_gej_is_infinity(&gej[i1]) ? NULL : &zr);
            /* Check Z ratio. */
            if (!secp256k1_gej_is_infinity(&gej[i1]) && !secp256k1_gej_is_infinity(&refj)) {
                secp256k1_fe zrz; secp256k1_fe_mul(&zrz, &zr, &gej[i1].z);
                CHECK(secp256k1_fe_equal(&zrz, &refj.z));
            }
            secp256k1_ge_set_gej_var(&ref, &refj);

            /* Test gej + ge with Z ratio result (var). */
            secp256k1_gej_add_ge_var(&resj, &gej[i1], &ge[i2], secp256k1_gej_is_infinity(&gej[i1]) ? NULL : &zr);
            CHECK(secp256k1_gej_eq_ge_var(&resj, &ref));
            if (!secp256k1_gej_is_infinity(&gej[i1]) && !secp256k1_gej_is_infinity(&resj)) {
                secp256k1_fe zrz; secp256k1_fe_mul(&zrz, &zr, &gej[i1].z);
                CHECK(secp256k1_fe_equal(&zrz, &resj.z));
            }

            /* Test gej + ge (var, with additional Z factor). */
            {
                secp256k1_ge ge2_zfi = ge[i2]; /* the second term with x and y rescaled for z = 1/zf */
                secp256k1_fe_mul(&ge2_zfi.x, &ge2_zfi.x, &zfi2);
                secp256k1_fe_mul(&ge2_zfi.y, &ge2_zfi.y, &zfi3);
                testutil_random_ge_x_magnitude(&ge2_zfi);
                testutil_random_ge_y_magnitude(&ge2_zfi);
                secp256k1_gej_add_zinv_var(&resj, &gej[i1], &ge2_zfi, &zf);
                CHECK(secp256k1_gej_eq_ge_var(&resj, &ref));
            }

            /* Test gej + ge (const). */
            if (i2 != 0) {
                /* secp256k1_gej_add_ge does not support its second argument being infinity. */
                secp256k1_gej_add_ge(&resj, &gej[i1], &ge[i2]);
                CHECK(secp256k1_gej_eq_ge_var(&resj, &ref));
            }

            /* Test doubling (var). */
            if ((i1 == 0 && i2 == 0) || ((i1 + 3)/4 == (i2 + 3)/4 && ((i1 + 3)%4)/2 == ((i2 + 3)%4)/2)) {
                secp256k1_fe zr2;
                /* Normal doubling with Z ratio result. */
                secp256k1_gej_double_var(&resj, &gej[i1], &zr2);
                CHECK(secp256k1_gej_eq_ge_var(&resj, &ref));
                /* Check Z ratio. */
                secp256k1_fe_mul(&zr2, &zr2, &gej[i1].z);
                CHECK(secp256k1_fe_equal(&zr2, &resj.z));
                /* Normal doubling. */
                secp256k1_gej_double_var(&resj, &gej[i2], NULL);
                CHECK(secp256k1_gej_eq_ge_var(&resj, &ref));
                /* Constant-time doubling. */
                secp256k1_gej_double(&resj, &gej[i2]);
                CHECK(secp256k1_gej_eq_ge_var(&resj, &ref));
            }

            /* Test adding opposites. */
            if ((i1 == 0 && i2 == 0) || ((i1 + 3)/4 == (i2 + 3)/4 && ((i1 + 3)%4)/2 != ((i2 + 3)%4)/2)) {
                CHECK(secp256k1_ge_is_infinity(&ref));
            }

            /* Test adding infinity. */
            if (i1 == 0) {
                CHECK(secp256k1_ge_is_infinity(&ge[i1]));
                CHECK(secp256k1_gej_is_infinity(&gej[i1]));
                CHECK(secp256k1_gej_eq_ge_var(&gej[i2], &ref));
            }
            if (i2 == 0) {
                CHECK(secp256k1_ge_is_infinity(&ge[i2]));
                CHECK(secp256k1_gej_is_infinity(&gej[i2]));
                CHECK(secp256k1_gej_eq_ge_var(&gej[i1], &ref));
            }
        }
    }

    /* Test adding all points together in random order equals infinity. */
    {
        secp256k1_gej sum = SECP256K1_GEJ_CONST_INFINITY;
        secp256k1_gej *gej_shuffled = (secp256k1_gej *)checked_malloc(&CTX->error_callback, (4 * runs + 1) * sizeof(secp256k1_gej));
        for (i = 0; i < 4 * runs + 1; i++) {
            gej_shuffled[i] = gej[i];
        }
        for (i = 0; i < 4 * runs + 1; i++) {
            int swap = i + testrand_int(4 * runs + 1 - i);
            if (swap != i) {
                secp256k1_gej t = gej_shuffled[i];
                gej_shuffled[i] = gej_shuffled[swap];
                gej_shuffled[swap] = t;
            }
        }
        for (i = 0; i < 4 * runs + 1; i++) {
            secp256k1_gej_add_var(&sum, &sum, &gej_shuffled[i], NULL);
        }
        CHECK(secp256k1_gej_is_infinity(&sum));
        free(gej_shuffled);
    }

    /* Test batch gej -> ge conversion without known z ratios. */
    {
        secp256k1_ge *ge_set_all = (secp256k1_ge *)checked_malloc(&CTX->error_callback, (4 * runs + 1) * sizeof(secp256k1_ge));
        secp256k1_ge_set_all_gej_var(ge_set_all, gej, 4 * runs + 1);
        for (i = 0; i < 4 * runs + 1; i++) {
            secp256k1_fe s;
            testutil_random_fe_non_zero(&s);
            secp256k1_gej_rescale(&gej[i], &s);
            CHECK(secp256k1_gej_eq_ge_var(&gej[i], &ge_set_all[i]));
        }
        free(ge_set_all);
    }

    /* Test that all elements have X coordinates on the curve. */
    for (i = 1; i < 4 * runs + 1; i++) {
        secp256k1_fe n;
        CHECK(secp256k1_ge_x_on_curve_var(&ge[i].x));
        /* And the same holds after random rescaling. */
        secp256k1_fe_mul(&n, &zf, &ge[i].x);
        CHECK(secp256k1_ge_x_frac_on_curve_var(&n, &zf));
    }

    /* Test correspondence of secp256k1_ge_x{,_frac}_on_curve_var with ge_set_xo. */
    {
        secp256k1_fe n;
        secp256k1_ge q;
        int ret_on_curve, ret_frac_on_curve, ret_set_xo;
        secp256k1_fe_mul(&n, &zf, &r);
        ret_on_curve = secp256k1_ge_x_on_curve_var(&r);
        ret_frac_on_curve = secp256k1_ge_x_frac_on_curve_var(&n, &zf);
        ret_set_xo = secp256k1_ge_set_xo_var(&q, &r, 0);
        CHECK(ret_on_curve == ret_frac_on_curve);
        CHECK(ret_on_curve == ret_set_xo);
        if (ret_set_xo) CHECK(secp256k1_fe_equal(&r, &q.x));
    }

    /* Test batch gej -> ge conversion with many infinities. */
    for (i = 0; i < 4 * runs + 1; i++) {
        int odd;
        testutil_random_ge_test(&ge[i]);
        odd = secp256k1_fe_is_odd(&ge[i].x);
        CHECK(odd == 0 || odd == 1);
        /* randomly set half the points to infinity */
        if (odd == i % 2) {
            secp256k1_ge_set_infinity(&ge[i]);
        }
        secp256k1_gej_set_ge(&gej[i], &ge[i]);
    }
    /* batch convert */
    secp256k1_ge_set_all_gej_var(ge, gej, 4 * runs + 1);
    /* check result */
    for (i = 0; i < 4 * runs + 1; i++) {
        CHECK(secp256k1_gej_eq_ge_var(&gej[i], &ge[i]));
    }

    /* Test batch gej -> ge conversion with all infinities. */
    for (i = 0; i < 4 * runs + 1; i++) {
        secp256k1_gej_set_infinity(&gej[i]);
    }
    /* batch convert */
    secp256k1_ge_set_all_gej_var(ge, gej, 4 * runs + 1);
    /* check result */
    for (i = 0; i < 4 * runs + 1; i++) {
        CHECK(secp256k1_ge_is_infinity(&ge[i]));
    }

    free(ge);
    free(gej);
}